

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O3

int Test_N_VWL2Norm(N_Vector X,N_Vector W,sunindextype param_3,sunindextype global_length,int myid)

{
  double dVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double __x;
  timespec spec;
  timespec local_38;
  
  N_VConst(-0.5,X);
  N_VConst(0.5,W);
  clock_gettime(4,&local_38);
  lVar2 = local_38.tv_sec - base_time_tv_sec;
  dVar1 = (double)local_38.tv_nsec;
  dVar5 = N_VWL2Norm(X,W);
  sync_device();
  clock_gettime(4,&local_38);
  lVar3 = local_38.tv_sec - base_time_tv_sec;
  dVar6 = 0.0;
  if (0.0 <= dVar5) {
    if (0 < global_length) {
      __x = (double)global_length;
      dVar6 = SQRT(__x);
      dVar7 = dVar6;
      if (__x < 0.0) {
        dVar7 = sqrt(__x);
      }
      if (__x < 0.0) {
        dVar6 = sqrt(__x);
      }
      dVar5 = dVar7 * -0.25 + dVar5;
      dVar6 = dVar6 * 0.25;
    }
    if (ABS(dVar5 / dVar6) <= 1e-15) {
      iVar4 = 0;
      if (myid == 0) {
        puts("PASSED test -- N_VWL2Norm ");
        iVar4 = 0;
      }
      goto LAB_00105f1e;
    }
  }
  printf(">>> FAILED test -- N_VWL2Norm, Proc %d \n",(ulong)(uint)myid);
  iVar4 = 1;
LAB_00105f1e:
  max_time(X,((double)local_38.tv_nsec / 1000000000.0 + (double)lVar3) -
             (dVar1 / 1000000000.0 + (double)lVar2));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VWL2Norm");
  }
  return iVar4;
}

Assistant:

int Test_N_VWL2Norm(N_Vector X, N_Vector W,
                    sunindextype local_length, sunindextype global_length, int myid)
{
  int      fails = 0, failure = 0;
  double   start_time, stop_time, maxt;
  realtype ans;

  /* fill vector data */
  N_VConst(NEG_HALF, X);
  N_VConst(HALF, W);

  start_time = get_time();
  ans = N_VWL2Norm(X, W);
  sync_device();
  stop_time = get_time();

  /* ans should equal 1/4 * sqrt(global_length) */
  failure = (ans < ZERO) ? 1 : FNEQ(ans, HALF*HALF*SUNRsqrt((realtype) global_length));

  if (failure) {
    printf(">>> FAILED test -- N_VWL2Norm, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VWL2Norm \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VWL2Norm", maxt);

  return(fails);
}